

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCipher.cpp
# Opt level: O0

void __thiscall security::SimpleCipher::Initialize(SimpleCipher *this,uint64_t encryptionKey)

{
  uint32_t uVar1;
  undefined8 in_RSI;
  uint32_t *in_RDI;
  
  *in_RDI = (uint32_t)in_RSI;
  in_RDI[1] = (uint32_t)((ulong)in_RSI >> 0x20);
  uVar1 = MultiplyAndFold19(0xe7988061,*in_RDI);
  in_RDI[2] = uVar1;
  uVar1 = MultiplyAndFold19(0xbd9fa5c7,in_RDI[1]);
  in_RDI[3] = uVar1;
  return;
}

Assistant:

void SimpleCipher::Initialize(uint64_t encryptionKey)
{
    // Expand connection key to four 32-bit words:

    static const uint32_t q0 = 0xe7988061;
    static const uint32_t q1 = 0xbd9fa5c7;

    ExpandedKey[0] = (uint32_t)encryptionKey;
    ExpandedKey[1] = (uint32_t)(encryptionKey >> 32);
    ExpandedKey[2] = MultiplyAndFold19(q0, ExpandedKey[0]);
    ExpandedKey[3] = MultiplyAndFold19(q1, ExpandedKey[1]);
}